

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O2

float range(float v,float lo,float hi,int *i)

{
  int iVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = hi - lo;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar2 = floorf((v - lo) / fVar3);
    lo = (v + lo) - fVar2 * fVar3;
    if (i == (int *)0x0) {
      return lo;
    }
    iVar1 = -(int)((double)((lo - v) / fVar3) + *(double *)(&DAT_001d5de0 + (ulong)(v < lo) * 8));
  }
  else {
    iVar1 = 0;
    if (i == (int *)0x0) {
      return lo;
    }
  }
  *i = iVar1;
  return lo;
}

Assistant:

static float range(float v, float lo, float hi, int* i = 0)
{
	float r = hi - lo;
	if (r == 0) {
		if (i)
			*i = 0;
		return lo;
	}
	float v2 = lo + v - r*std::floor((v - lo)/r);
	if (i)
		*i = -(int)((v2 - v)/r + (v2 > v ? 0.5 : -0.5));
	return v2;
}